

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<unsigned_int,char_const(&)[2],unsigned_int&,char_const(&)[3],kj::StringPtr&>
          (String *__return_storage_ptr__,kj *this,uint *params,char (*params_1) [2],uint *params_2,
          char (*params_3) [3],StringPtr *params_4)

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  CappedArray<char,_14UL> local_90;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  toCharSequence<unsigned_int>(&local_90,(uint *)this);
  local_58 = toCharSequence<char_const(&)[2]>((char (*) [2])params);
  toCharSequence<unsigned_int&>(&local_48,(kj *)params_1,(uint *)local_58.size_);
  local_68 = toCharSequence<char_const(&)[3]>((char (*) [3])params_2);
  local_78.ptr = *(char **)params_3;
  local_78.size_ = *(long *)(params_3[2] + 2) - 1;
  _::
  concat<kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_90,(CappedArray<char,_14UL> *)&local_58,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_68,&local_78,
             in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}